

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLCellLinOp::BndryCondLoc::setLOBndryConds
          (BndryCondLoc *this,Geometry *geom,Real *dx,
          Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          *lobc,Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *hibc,int ratio,RealVect *interior_bloc,Array<Real,_3> *domain_bloc_lo,
          Array<Real,_3> *domain_bloc_hi)

{
  int iVar1;
  bool bVar2;
  array<amrex::LinOpBCType,_3UL> *hi;
  array<amrex::LinOpBCType,_3UL> *lo;
  reference pvVar3;
  reference pvVar4;
  iterator pGVar5;
  iterator pGVar6;
  iterator pGVar7;
  MFIter *in_RDX;
  Geometry *in_RSI;
  Box *in_RDI;
  undefined4 in_R9D;
  GpuArray<int,_3U> GVar8;
  MFIter *in_stack_00000010;
  int m;
  GpuArray<amrex::MLCellLinOp::BCTL,_6U> tmp;
  int icomp_1;
  MFIter mfi_1;
  PinnedVector<GpuArray<BCTL,_2_*_3>_> hv;
  BCTuple *bctag;
  RealTuple *bloc;
  int icomp;
  Box *bx;
  MFIter mfi;
  Box *domain;
  MFIter *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  MFIter *in_stack_fffffffffffffd50;
  undefined8 *in_stack_fffffffffffffd60;
  uchar flags_;
  FabArrayBase *in_stack_fffffffffffffd68;
  MFIter *in_stack_fffffffffffffd70;
  Box *domain_00;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  int iVar9;
  RealTuple *in_stack_fffffffffffffdd8;
  value_type_conflict1 avStack_220 [4];
  Real *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe08;
  RealVect *in_stack_fffffffffffffe10;
  Array<Real,_3> *in_stack_fffffffffffffe18;
  Array<Real,_3> *in_stack_fffffffffffffe20;
  GpuArray<int,_3U> *in_stack_fffffffffffffe28;
  int local_1c4;
  MFIter local_1c0;
  PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
  local_160;
  int local_138 [3];
  undefined8 local_128;
  int local_120;
  array<amrex::BoundCond,_6UL> *local_118;
  array<double,_6UL> *local_110;
  int local_108;
  Box local_104;
  Box *local_e8;
  MFIter local_e0;
  Box *local_80;
  undefined4 local_74;
  MFIter *local_60;
  Geometry *local_58;
  int local_44;
  undefined1 *local_40;
  int local_34;
  undefined1 *local_30;
  
  local_74 = in_R9D;
  local_60 = in_RDX;
  local_58 = in_RSI;
  local_80 = Geometry::Domain(in_RSI);
  MFIter::MFIter(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                 (uchar)((ulong)in_stack_fffffffffffffd60 >> 0x38));
  while( true ) {
    bVar2 = MFIter::isValid(&local_e0);
    flags_ = (uchar)((ulong)in_stack_fffffffffffffd60 >> 0x38);
    if (!bVar2) break;
    MFIter::validbox(in_stack_fffffffffffffd50);
    local_e8 = &local_104;
    for (local_108 = 0; local_108 < in_RDI[0x1e].smallend.vect[0]; local_108 = local_108 + 1) {
      LayoutData<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>
      ::operator[]((LayoutData<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                   in_stack_fffffffffffffd38);
      local_110 = Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>::
                  operator[]((Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                             (size_type)in_stack_fffffffffffffd38);
      LayoutData<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>
      ::operator[]((LayoutData<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                   in_stack_fffffffffffffd38);
      local_118 = Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                  ::operator[]((Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                               (size_type)in_stack_fffffffffffffd38);
      domain_00 = local_e8;
      hi = Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                        (size_type)in_stack_fffffffffffffd38);
      lo = Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                        (size_type)in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd38 = local_60;
      in_stack_fffffffffffffd40 = local_74;
      GVar8 = Geometry::isPeriodicArray(local_58);
      local_138[2] = GVar8.arr[2];
      local_120 = local_138[2];
      local_138._0_8_ = GVar8.arr._0_8_;
      local_128._0_4_ = local_138[0];
      local_128._4_4_ = local_138[1];
      in_stack_fffffffffffffd60 = &local_128;
      in_stack_fffffffffffffd50 = in_stack_00000010;
      local_138 = GVar8.arr;
      MLMGBndry::setBoxBC(in_stack_fffffffffffffdd8,
                          (BCTuple *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                          in_RDI,domain_00,lo,hi,in_stack_fffffffffffffe00,in_stack_fffffffffffffe08
                          ,in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,
                          in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
    }
    MFIter::operator++(&local_e0);
  }
  MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
  ::PODVector((PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
               *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
  ::size((PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
          *)(in_RDI[0x1d].smallend.vect + 1));
  PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
  ::reserve((PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
             *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
            (size_type)in_stack_fffffffffffffd38);
  MFIter::MFIter(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,flags_);
  while( true ) {
    bVar2 = MFIter::isValid(&local_1c0);
    if (!bVar2) break;
    for (local_1c4 = 0; local_1c4 < in_RDI[0x1e].smallend.vect[0]; local_1c4 = local_1c4 + 1) {
      GpuArray<amrex::MLCellLinOp::BCTL,_6U>::GpuArray
                ((GpuArray<amrex::MLCellLinOp::BCTL,_6U> *)in_stack_fffffffffffffd50);
      iVar1 = 0;
      while (iVar9 = iVar1, iVar9 < 6) {
        LayoutData<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>
        ::operator[]((LayoutData<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     in_stack_fffffffffffffd38);
        Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
        ::operator[]((Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     (size_type)in_stack_fffffffffffffd38);
        pvVar3 = std::array<amrex::BoundCond,_6UL>::operator[]
                           ((array<amrex::BoundCond,_6UL> *)
                            CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                            (size_type)in_stack_fffffffffffffd38);
        local_30 = &stack0xfffffffffffffdd8;
        *(int *)(local_30 + (long)iVar9 * 0x10) = pvVar3->bctype;
        local_34 = iVar9;
        LayoutData<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>
        ::operator[]((LayoutData<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     in_stack_fffffffffffffd38);
        Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>::operator[]
                  ((Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_> *)
                   CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                   (size_type)in_stack_fffffffffffffd38);
        pvVar4 = std::array<double,_6UL>::operator[]
                           ((array<double,_6UL> *)
                            CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                            (size_type)in_stack_fffffffffffffd38);
        local_40 = &stack0xfffffffffffffdd8;
        avStack_220[(long)iVar9 * 2] = *pvVar4;
        local_44 = iVar9;
        iVar1 = iVar9 + 1;
      }
      PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
      ::push_back((PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
                   *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                  (GpuArray<amrex::MLCellLinOp::BCTL,_6U> *)in_stack_fffffffffffffd38);
    }
    MFIter::operator++(&local_1c0);
  }
  MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  pGVar5 = PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
           ::begin(&local_160);
  pGVar6 = PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
           ::end(&local_160);
  pGVar7 = PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
           ::begin((PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
                    *)(in_RDI[0x1d].smallend.vect + 1));
  Gpu::
  copyAsync<amrex::GpuArray<amrex::MLCellLinOp::BCTL,6u>*,amrex::GpuArray<amrex::MLCellLinOp::BCTL,6u>*>
            (pGVar5,pGVar6,pGVar7);
  Gpu::streamSynchronize();
  PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
  ::~PODVector((PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
                *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  return;
}

Assistant:

void
MLCellLinOp::BndryCondLoc::setLOBndryConds (const Geometry& geom, const Real* dx,
                                            const Vector<Array<BCType,AMREX_SPACEDIM> >& lobc,
                                            const Vector<Array<BCType,AMREX_SPACEDIM> >& hibc,
                                            int ratio, const RealVect& interior_bloc,
                                            const Array<Real,AMREX_SPACEDIM>& domain_bloc_lo,
                                            const Array<Real,AMREX_SPACEDIM>& domain_bloc_hi)
{
    const Box& domain = geom.Domain();

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter mfi(bcloc); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.validbox();
        for (int icomp = 0; icomp < m_ncomp; ++icomp) {
            RealTuple & bloc  = bcloc[mfi][icomp];
            BCTuple   & bctag = bcond[mfi][icomp];
            MLMGBndry::setBoxBC(bloc, bctag, bx, domain, lobc[icomp], hibc[icomp],
                                dx, ratio, interior_bloc, domain_bloc_lo, domain_bloc_hi,
                                geom.isPeriodicArray());
        }
    }

    Gpu::PinnedVector<GpuArray<BCTL,2*AMREX_SPACEDIM> > hv;
    hv.reserve(bctl_dv.size());
    for (MFIter mfi(bctl); mfi.isValid(); ++mfi)
    {
        for (int icomp = 0; icomp < m_ncomp; ++icomp) {
            GpuArray<BCTL,2*AMREX_SPACEDIM> tmp;
            for (int m = 0; m < 2*AMREX_SPACEDIM; ++m) {
                tmp[m].type = bcond[mfi][icomp][m];
                tmp[m].location = bcloc[mfi][icomp][m];
            }
            hv.push_back(std::move(tmp));
        }
    }
    Gpu::copyAsync(Gpu::hostToDevice, hv.begin(), hv.end(), bctl_dv.begin());
    Gpu::streamSynchronize();
}